

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTest<(anonymous_namespace)::BitFieldAssignment,_testing::internal::TemplateSel<BitFieldAssignment_Assignment_Test>,_testing::internal::Types<(anonymous_namespace)::param<unsigned_int,_16U,_1U>,_(anonymous_namespace)::param<unsigned_int,_31U,_1U>,_(anonymous_namespace)::param<unsigned_long,_32U,_1U>,_(anonymous_namespace)::param<unsigned_long,_63U,_1U>,_(anonymous_namespace)::param<unsigned_char,_0U,_2U>,_(anonymous_namespace)::param<unsigned_char,_1U,_2U>,_(anonymous_namespace)::param<unsigned_char,_6U,_2U>,_(anonymous_namespace)::param<unsigned_short,_7U,_2U>,_(anonymous_namespace)::param<unsigned_short,_8U,_2U>,_(anonymous_namespace)::param<unsigned_short,_14U,_2U>,_(anonymous_namespace)::param<unsigned_int,_15U,_2U>,_(anonymous_namespace)::param<unsigned_int,_16U,_2U>,_(anonymous_namespace)::param<unsigned_long,_31U,_2U>,_(anonymous_namespace)::param<unsigned_long,_32U,_2U>,_(anonymous_namespace)::param<unsigned_long,_62U,_2U>,_(anonymous_namespace)::param<unsigned_char,_0U,_7U>,_(anonymous_namespace)::param<unsigned_char,_0U,_8U>,_(anonymous_namespace)::param<unsigned_short,_0U,_9U>,_(anonymous_namespace)::param<unsigned_short,_0U,_15U>,_(anonymous_namespace)::param<unsigned_short,_0U,_16U>,_(anonymous_namespace)::param<unsigned_int,_0U,_17U>,_(anonymous_namespace)::param<unsigned_int,_0U,_31U>,_(anonymous_namespace)::param<unsigned_int,_0U,_32U>,_(anonymous_namespace)::param<unsigned_long,_0U,_63U>,_(anonymous_namespace)::param<unsigned_long,_0U,_64U>_>_>
     ::Register(char *prefix,CodeLocation *code_location,char *case_name,char *test_names,int index,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  _Alloc_hider _Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  ulong *puVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  size_t sVar7;
  TestFactoryBase *pTVar8;
  size_type *psVar9;
  long *plVar10;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *extraout_RDX_03;
  type_info *extraout_RDX_04;
  type_info *extraout_RDX_05;
  type_info *extraout_RDX_06;
  type_info *extraout_RDX_07;
  type_info *extraout_RDX_08;
  type_info *extraout_RDX_09;
  type_info *ptVar11;
  char *extraout_RDX_10;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  undefined1 *puVar12;
  ulong *puVar13;
  undefined4 in_register_00000084;
  CodeLocation *code_location_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *type_names_00;
  ulong *puVar14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar15;
  ulong uVar16;
  char *pcVar17;
  char *pcVar18;
  long *local_290;
  long local_288;
  long local_280;
  long lStack_278;
  ulong *local_270;
  long local_268;
  ulong local_260;
  long lStack_258;
  GTestLog local_24c;
  string local_248;
  CodeLocation local_228;
  string local_200;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1e0;
  CodeLocation local_1d8;
  string local_1b0;
  CodeLocation *local_190;
  CodeLocation local_188;
  string local_160;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_140;
  size_type local_138;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_130;
  ulong *local_120;
  long local_118;
  undefined1 local_110;
  undefined7 uStack_10f;
  long lStack_108;
  CodeLocation local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  size_type local_b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  size_type local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  CodeLocation local_78;
  string local_50;
  
  local_290 = &local_280;
  local_190 = code_location;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_290,anon_var_dwarf_d372b + 0x50,anon_var_dwarf_d372b + 0x50,test_names
             ,CONCAT44(in_register_00000084,index));
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
  local_100.file._M_dataplus._M_p = (pointer)&local_100.file.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_100.file.field_2._M_allocated_capacity = *psVar9;
    local_100.file.field_2._8_8_ = plVar6[3];
  }
  else {
    local_100.file.field_2._M_allocated_capacity = *psVar9;
    local_100.file._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_100.file._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_100);
  local_188.file._M_dataplus._M_p = (pointer)&local_188.file.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_188.file.field_2._M_allocated_capacity = *psVar9;
    local_188.file.field_2._8_8_ = plVar6[3];
  }
  else {
    local_188.file.field_2._M_allocated_capacity = *psVar9;
    local_188.file._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_188.file._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_1d8.file._M_dataplus._M_p = (pointer)&local_1d8.file.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_1d8.file.field_2._M_allocated_capacity = *psVar9;
    local_1d8.file.field_2._8_8_ = plVar6[3];
  }
  else {
    local_1d8.file.field_2._M_allocated_capacity = *psVar9;
    local_1d8.file._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1d8.file._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1d8,
                              *(ulong *)((local_190->file)._M_dataplus._M_p + 0xa0));
  local_228.file._M_dataplus._M_p = (pointer)&local_228.file.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_228.file.field_2._M_allocated_capacity = *psVar9;
    local_228.file.field_2._8_8_ = plVar6[3];
  }
  else {
    local_228.file.field_2._M_allocated_capacity = *psVar9;
    local_228.file._M_dataplus._M_p = (pointer)*plVar6;
  }
  _Var1._M_p = local_228.file._M_dataplus._M_p;
  local_228.file._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_120 = (ulong *)&local_110;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"Assignment","");
  local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)_Var1._M_p;
  ptVar11 = extraout_RDX;
  puVar14 = local_120;
  if (local_118 != 0) {
    puVar12 = (undefined1 *)((long)local_120 + local_118);
    do {
      puVar3 = local_120;
      iVar5 = isspace((uint)(byte)puVar12[-1]);
      ptVar11 = extraout_RDX_00;
      puVar14 = puVar3;
      if (iVar5 == 0) break;
      puVar13 = (ulong *)(puVar12 + -1);
      uVar16 = (long)puVar13 - (long)puVar3;
      std::__cxx11::string::_M_erase((ulong)&local_120,uVar16);
      puVar12 = (undefined1 *)((long)local_120 + uVar16);
      ptVar11 = extraout_RDX_01;
      puVar14 = local_120;
    } while (puVar13 != puVar3);
  }
  local_120 = (ulong *)&local_110;
  if (puVar14 == local_120) {
    lStack_258 = lStack_108;
    puVar14 = &local_260;
  }
  local_260 = CONCAT71(uStack_10f,local_110);
  local_268 = local_118;
  local_118 = 0;
  local_110 = 0;
  local_270 = puVar14;
  GetTypeName_abi_cxx11_
            (&local_248,(internal *)&::(anonymous_namespace)::param<unsigned_int,16u,1u>::typeinfo,
             ptVar11);
  _Var1._M_p = local_248._M_dataplus._M_p;
  local_78.file._M_dataplus._M_p = (pointer)&local_78.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar5 = *(int *)(prefix + 0x20);
  pcVar17 = *(char **)prefix;
  local_78.line = iVar5;
  bVar4 = IsTrue(true);
  if (!bVar4) {
    GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x232748);
    }
    else {
      sVar7 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    GTestLog::~GTestLog((GTestLog *)&local_200);
  }
  pcVar17 = *(char **)prefix;
  iVar5 = *(int *)(prefix + 0x20);
  bVar4 = IsTrue(true);
  if (!bVar4) {
    GTestLog::GTestLog((GTestLog *)&local_200,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x232748);
    }
    else {
      sVar7 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    GTestLog::~GTestLog((GTestLog *)&local_200);
  }
  pTVar8 = (TestFactoryBase *)operator_new(8);
  pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00225a08;
  MakeAndRegisterTestInfo
            (local_1e0->_M_local_buf,(char *)puVar14,_Var1._M_p,(char *)0x0,&local_78,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_int,16u,1u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != &local_78.file.field_2) {
    operator_delete(local_78.file._M_dataplus._M_p,local_78.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if (local_120 != (ulong *)&local_110) {
    operator_delete(local_120,CONCAT71(uStack_10f,local_110) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.file._M_dataplus._M_p != &local_228.file.field_2) {
    operator_delete(local_228.file._M_dataplus._M_p,local_228.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.file._M_dataplus._M_p != &local_1d8.file.field_2) {
    operator_delete(local_1d8.file._M_dataplus._M_p,local_1d8.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.file._M_dataplus._M_p != &local_188.file.field_2) {
    operator_delete(local_188.file._M_dataplus._M_p,local_188.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.file._M_dataplus._M_p != &local_100.file.field_2) {
    operator_delete(local_100.file._M_dataplus._M_p,local_100.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  local_270 = &local_260;
  local_268 = 0;
  local_260 = local_260 & 0xffffffffffffff00;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
  local_290 = &local_280;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_280 = *plVar10;
    lStack_278 = plVar6[3];
  }
  else {
    local_280 = *plVar10;
    local_290 = (long *)*plVar6;
  }
  local_288 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
  local_188.file._M_dataplus._M_p = (pointer)&local_188.file.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_188.file.field_2._M_allocated_capacity = *psVar9;
    local_188.file.field_2._8_8_ = plVar6[3];
  }
  else {
    local_188.file.field_2._M_allocated_capacity = *psVar9;
    local_188.file._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_188.file._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_188);
  local_1d8.file._M_dataplus._M_p = (pointer)&local_1d8.file.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_1d8.file.field_2._M_allocated_capacity = *psVar9;
    local_1d8.file.field_2._8_8_ = plVar6[3];
  }
  else {
    local_1d8.file.field_2._M_allocated_capacity = *psVar9;
    local_1d8.file._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1d8.file._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1d8,
                              *(ulong *)((local_190->file)._M_dataplus._M_p + 0xc0));
  local_228.file._M_dataplus._M_p = (pointer)&local_228.file.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_228.file.field_2._M_allocated_capacity = *psVar9;
    local_228.file.field_2._8_8_ = plVar6[3];
  }
  else {
    local_228.file.field_2._M_allocated_capacity = *psVar9;
    local_228.file._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_228.file._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228.file._M_dataplus._M_p;
  local_d8 = &local_c8;
  local_c8._M_allocated_capacity = 0x656d6e6769737341;
  local_c8._8_2_ = 0x746e;
  local_d0 = 10;
  pcVar17 = local_c8._M_local_buf + 10;
  local_c8._M_local_buf[10] = '\0';
  do {
    paVar2 = local_d8;
    iVar5 = isspace((uint)(byte)pcVar17[-1]);
    ptVar11 = extraout_RDX_02;
    paVar15 = paVar2;
    if (iVar5 == 0) break;
    pcVar18 = pcVar17 + -1;
    uVar16 = (long)pcVar18 - (long)paVar2;
    std::__cxx11::string::_M_erase((ulong)&local_d8,uVar16);
    pcVar17 = local_d8->_M_local_buf + uVar16;
    ptVar11 = extraout_RDX_03;
    paVar15 = local_d8;
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar18 != paVar2);
  local_d8 = &local_c8;
  if (paVar15 == local_d8) {
    local_248.field_2._8_8_ =
         CONCAT53(local_c8._11_5_,CONCAT12(local_c8._M_local_buf[10],local_c8._8_2_));
    paVar15 = &local_248.field_2;
  }
  local_248.field_2._M_allocated_capacity = local_c8._M_allocated_capacity;
  local_248._M_string_length = local_d0;
  local_d0 = 0;
  local_c8._M_allocated_capacity = local_c8._M_allocated_capacity & 0xffffffffffffff00;
  local_248._M_dataplus._M_p = (pointer)paVar15;
  GetTypeName_abi_cxx11_
            (&local_200,(internal *)&::(anonymous_namespace)::param<unsigned_int,31u,1u>::typeinfo,
             ptVar11);
  _Var1._M_p = local_200._M_dataplus._M_p;
  local_100.file._M_dataplus._M_p = (pointer)&local_100.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_100,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar5 = *(int *)(prefix + 0x20);
  pcVar17 = *(char **)prefix;
  local_100.line = iVar5;
  bVar4 = IsTrue(true);
  if (!bVar4) {
    GTestLog::GTestLog((GTestLog *)&local_1b0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x232748);
    }
    else {
      sVar7 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    GTestLog::~GTestLog((GTestLog *)&local_1b0);
  }
  pcVar17 = *(char **)prefix;
  iVar5 = *(int *)(prefix + 0x20);
  bVar4 = IsTrue(true);
  if (!bVar4) {
    GTestLog::GTestLog((GTestLog *)&local_1b0,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x232748);
    }
    else {
      sVar7 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    GTestLog::~GTestLog((GTestLog *)&local_1b0);
  }
  pTVar8 = (TestFactoryBase *)operator_new(8);
  pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00225ac8;
  MakeAndRegisterTestInfo
            (local_1e0->_M_local_buf,paVar15->_M_local_buf,_Var1._M_p,(char *)0x0,&local_100,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_int,31u,1u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100.file._M_dataplus._M_p != &local_100.file.field_2) {
    operator_delete(local_100.file._M_dataplus._M_p,local_100.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if (local_d8 != &local_c8) {
    operator_delete(local_d8,local_c8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.file._M_dataplus._M_p != &local_228.file.field_2) {
    operator_delete(local_228.file._M_dataplus._M_p,local_228.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.file._M_dataplus._M_p != &local_1d8.file.field_2) {
    operator_delete(local_1d8.file._M_dataplus._M_p,local_1d8.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.file._M_dataplus._M_p != &local_188.file.field_2) {
    operator_delete(local_188.file._M_dataplus._M_p,local_188.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  local_248._M_string_length = 0;
  local_248.field_2._M_allocated_capacity =
       local_248.field_2._M_allocated_capacity & 0xffffffffffffff00;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_270 = &local_260;
  puVar14 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar14) {
    local_260 = *puVar14;
    lStack_258 = plVar6[3];
  }
  else {
    local_260 = *puVar14;
    local_270 = (ulong *)*plVar6;
  }
  local_268 = plVar6[1];
  *plVar6 = (long)puVar14;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
  local_290 = &local_280;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_280 = *plVar10;
    lStack_278 = plVar6[3];
  }
  else {
    local_280 = *plVar10;
    local_290 = (long *)*plVar6;
  }
  local_288 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_290);
  local_1d8.file._M_dataplus._M_p = (pointer)&local_1d8.file.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_1d8.file.field_2._M_allocated_capacity = *psVar9;
    local_1d8.file.field_2._8_8_ = plVar6[3];
  }
  else {
    local_1d8.file.field_2._M_allocated_capacity = *psVar9;
    local_1d8.file._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_1d8.file._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_1d8,
                              *(ulong *)((local_190->file)._M_dataplus._M_p + 0xe0));
  local_228.file._M_dataplus._M_p = (pointer)&local_228.file.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_228.file.field_2._M_allocated_capacity = *psVar9;
    local_228.file.field_2._8_8_ = plVar6[3];
  }
  else {
    local_228.file.field_2._M_allocated_capacity = *psVar9;
    local_228.file._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_228.file._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228.file._M_dataplus._M_p;
  local_b8 = &local_a8;
  local_a8._M_allocated_capacity = 0x656d6e6769737341;
  local_a8._8_2_ = 0x746e;
  local_b0 = 10;
  pcVar17 = local_a8._M_local_buf + 10;
  local_a8._M_local_buf[10] = '\0';
  do {
    paVar2 = local_b8;
    iVar5 = isspace((uint)(byte)pcVar17[-1]);
    ptVar11 = extraout_RDX_04;
    paVar15 = paVar2;
    if (iVar5 == 0) break;
    pcVar18 = pcVar17 + -1;
    uVar16 = (long)pcVar18 - (long)paVar2;
    std::__cxx11::string::_M_erase((ulong)&local_b8,uVar16);
    pcVar17 = local_b8->_M_local_buf + uVar16;
    ptVar11 = extraout_RDX_05;
    paVar15 = local_b8;
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar18 != paVar2);
  local_b8 = &local_a8;
  if (paVar15 == local_b8) {
    local_200.field_2._8_8_ =
         CONCAT53(local_a8._11_5_,CONCAT12(local_a8._M_local_buf[10],local_a8._8_2_));
    paVar15 = &local_200.field_2;
  }
  local_200.field_2._M_allocated_capacity = local_a8._M_allocated_capacity;
  local_200._M_string_length = local_b0;
  local_b0 = 0;
  local_a8._M_allocated_capacity = local_a8._M_allocated_capacity & 0xffffffffffffff00;
  local_200._M_dataplus._M_p = (pointer)paVar15;
  GetTypeName_abi_cxx11_
            (&local_1b0,(internal *)&::(anonymous_namespace)::param<unsigned_long,32u,1u>::typeinfo,
             ptVar11);
  _Var1._M_p = local_1b0._M_dataplus._M_p;
  local_188.file._M_dataplus._M_p = (pointer)&local_188.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar5 = *(int *)(prefix + 0x20);
  pcVar17 = *(char **)prefix;
  local_188.line = iVar5;
  bVar4 = IsTrue(true);
  if (!bVar4) {
    GTestLog::GTestLog((GTestLog *)&local_160,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x232748);
    }
    else {
      sVar7 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    GTestLog::~GTestLog((GTestLog *)&local_160);
  }
  pcVar17 = *(char **)prefix;
  iVar5 = *(int *)(prefix + 0x20);
  bVar4 = IsTrue(true);
  if (!bVar4) {
    GTestLog::GTestLog((GTestLog *)&local_160,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x232748);
    }
    else {
      sVar7 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    GTestLog::~GTestLog((GTestLog *)&local_160);
  }
  pTVar8 = (TestFactoryBase *)operator_new(8);
  pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00225b88;
  MakeAndRegisterTestInfo
            (local_1e0->_M_local_buf,paVar15->_M_local_buf,_Var1._M_p,(char *)0x0,&local_188,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_long,32u,1u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188.file._M_dataplus._M_p != &local_188.file.field_2) {
    operator_delete(local_188.file._M_dataplus._M_p,local_188.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,local_a8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.file._M_dataplus._M_p != &local_228.file.field_2) {
    operator_delete(local_228.file._M_dataplus._M_p,local_228.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.file._M_dataplus._M_p != &local_1d8.file.field_2) {
    operator_delete(local_1d8.file._M_dataplus._M_p,local_1d8.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  local_200._M_string_length = 0;
  local_200.field_2._M_allocated_capacity =
       local_200.field_2._M_allocated_capacity & 0xffffffffffffff00;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_200);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248.field_2._8_8_ = plVar6[3];
  }
  else {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_248._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_270 = &local_260;
  puVar14 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar14) {
    local_260 = *puVar14;
    lStack_258 = plVar6[3];
  }
  else {
    local_260 = *puVar14;
    local_270 = (ulong *)*plVar6;
  }
  local_268 = plVar6[1];
  *plVar6 = (long)puVar14;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_270);
  local_290 = &local_280;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_280 = *plVar10;
    lStack_278 = plVar6[3];
  }
  else {
    local_280 = *plVar10;
    local_290 = (long *)*plVar6;
  }
  local_288 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_290,
                              *(ulong *)((local_190->file)._M_dataplus._M_p + 0x100));
  local_228.file._M_dataplus._M_p = (pointer)&local_228.file.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_228.file.field_2._M_allocated_capacity = *psVar9;
    local_228.file.field_2._8_8_ = plVar6[3];
  }
  else {
    local_228.file.field_2._M_allocated_capacity = *psVar9;
    local_228.file._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_228.file._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_228.file._M_dataplus._M_p;
  local_98 = &local_88;
  local_88._M_allocated_capacity = 0x656d6e6769737341;
  local_88._8_2_ = 0x746e;
  local_90 = 10;
  pcVar17 = local_88._M_local_buf + 10;
  local_88._M_local_buf[10] = '\0';
  do {
    paVar2 = local_98;
    iVar5 = isspace((uint)(byte)pcVar17[-1]);
    ptVar11 = extraout_RDX_06;
    paVar15 = paVar2;
    if (iVar5 == 0) break;
    pcVar18 = pcVar17 + -1;
    uVar16 = (long)pcVar18 - (long)paVar2;
    std::__cxx11::string::_M_erase((ulong)&local_98,uVar16);
    pcVar17 = local_98->_M_local_buf + uVar16;
    ptVar11 = extraout_RDX_07;
    paVar15 = local_98;
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar18 != paVar2);
  local_98 = &local_88;
  if (paVar15 == local_98) {
    local_1b0.field_2._8_8_ =
         CONCAT53(local_88._11_5_,CONCAT12(local_88._M_local_buf[10],local_88._8_2_));
    paVar15 = &local_1b0.field_2;
  }
  local_1b0.field_2._M_allocated_capacity = local_88._M_allocated_capacity;
  local_1b0._M_string_length = local_90;
  local_90 = 0;
  local_88._M_allocated_capacity = local_88._M_allocated_capacity & 0xffffffffffffff00;
  local_1b0._M_dataplus._M_p = (pointer)paVar15;
  GetTypeName_abi_cxx11_
            (&local_160,(internal *)&::(anonymous_namespace)::param<unsigned_long,63u,1u>::typeinfo,
             ptVar11);
  _Var1._M_p = local_160._M_dataplus._M_p;
  local_1d8.file._M_dataplus._M_p = (pointer)&local_1d8.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1d8,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar5 = *(int *)(prefix + 0x20);
  pcVar17 = *(char **)prefix;
  local_1d8.line = iVar5;
  bVar4 = IsTrue(true);
  if (!bVar4) {
    GTestLog::GTestLog((GTestLog *)&local_140,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x232748);
    }
    else {
      sVar7 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    GTestLog::~GTestLog((GTestLog *)&local_140);
  }
  pcVar17 = *(char **)prefix;
  iVar5 = *(int *)(prefix + 0x20);
  bVar4 = IsTrue(true);
  if (!bVar4) {
    GTestLog::GTestLog((GTestLog *)&local_140,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x232748);
    }
    else {
      sVar7 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    GTestLog::~GTestLog((GTestLog *)&local_140);
  }
  pTVar8 = (TestFactoryBase *)operator_new(8);
  pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00225c48;
  MakeAndRegisterTestInfo
            (local_1e0->_M_local_buf,paVar15->_M_local_buf,_Var1._M_p,(char *)0x0,&local_1d8,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_long,63u,1u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8.file._M_dataplus._M_p != &local_1d8.file.field_2) {
    operator_delete(local_1d8.file._M_dataplus._M_p,local_1d8.file.field_2._M_allocated_capacity + 1
                   );
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.file._M_dataplus._M_p != &local_228.file.field_2) {
    operator_delete(local_228.file._M_dataplus._M_p,local_228.file.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  local_1b0._M_string_length = 0;
  local_1b0.field_2._M_allocated_capacity =
       local_1b0.field_2._M_allocated_capacity & 0xffffffffffffff00;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  local_200._M_dataplus._M_p = (pointer)&local_200.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_200.field_2._M_allocated_capacity = *psVar9;
    local_200.field_2._8_8_ = plVar6[3];
  }
  else {
    local_200.field_2._M_allocated_capacity = *psVar9;
    local_200._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_200._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_200);
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  psVar9 = (size_type *)(plVar6 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248.field_2._8_8_ = plVar6[3];
  }
  else {
    local_248.field_2._M_allocated_capacity = *psVar9;
    local_248._M_dataplus._M_p = (pointer)*plVar6;
  }
  local_248._M_string_length = plVar6[1];
  *plVar6 = (long)psVar9;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_248);
  local_270 = &local_260;
  puVar14 = (ulong *)(plVar6 + 2);
  if ((ulong *)*plVar6 == puVar14) {
    local_260 = *puVar14;
    lStack_258 = plVar6[3];
  }
  else {
    local_260 = *puVar14;
    local_270 = (ulong *)*plVar6;
  }
  local_268 = plVar6[1];
  *plVar6 = (long)puVar14;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  plVar6 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_270,
                              *(ulong *)((local_190->file)._M_dataplus._M_p + 0x120));
  local_290 = &local_280;
  plVar10 = plVar6 + 2;
  if ((long *)*plVar6 == plVar10) {
    local_280 = *plVar10;
    lStack_278 = plVar6[3];
  }
  else {
    local_280 = *plVar10;
    local_290 = (long *)*plVar6;
  }
  local_288 = plVar6[1];
  *plVar6 = (long)plVar10;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  local_1e0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_290;
  local_140 = &local_130;
  local_130._M_allocated_capacity = 0x656d6e6769737341;
  local_130._8_2_ = 0x746e;
  local_138 = 10;
  pcVar17 = local_130._M_local_buf + 10;
  local_130._M_local_buf[10] = '\0';
  do {
    paVar2 = local_140;
    iVar5 = isspace((uint)(byte)pcVar17[-1]);
    ptVar11 = extraout_RDX_08;
    paVar15 = paVar2;
    if (iVar5 == 0) break;
    pcVar18 = pcVar17 + -1;
    uVar16 = (long)pcVar18 - (long)paVar2;
    std::__cxx11::string::_M_erase((ulong)&local_140,uVar16);
    pcVar17 = local_140->_M_local_buf + uVar16;
    ptVar11 = extraout_RDX_09;
    paVar15 = local_140;
  } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)pcVar18 != paVar2);
  local_140 = &local_130;
  if (paVar15 == local_140) {
    local_160.field_2._8_8_ =
         CONCAT53(local_130._11_5_,CONCAT12(local_130._M_local_buf[10],local_130._8_2_));
    paVar15 = &local_160.field_2;
  }
  local_160.field_2._M_allocated_capacity = local_130._M_allocated_capacity;
  local_160._M_string_length = local_138;
  local_138 = 0;
  local_130._M_allocated_capacity = local_130._M_allocated_capacity & 0xffffffffffffff00;
  local_160._M_dataplus._M_p = (pointer)paVar15;
  GetTypeName_abi_cxx11_
            (&local_50,(internal *)&::(anonymous_namespace)::param<unsigned_char,0u,2u>::typeinfo,
             ptVar11);
  _Var1._M_p = local_50._M_dataplus._M_p;
  local_228.file._M_dataplus._M_p = (pointer)&local_228.file.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_228,*(long *)prefix,*(long *)(prefix + 8) + *(long *)prefix);
  iVar5 = *(int *)(prefix + 0x20);
  pcVar17 = *(char **)prefix;
  local_228.line = iVar5;
  bVar4 = IsTrue(true);
  if (!bVar4) {
    GTestLog::GTestLog(&local_24c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x211);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both SetUpTestSuite and SetUpTestCase, please make sure there is only one present at "
               ,0x6a);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x232748);
    }
    else {
      sVar7 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    GTestLog::~GTestLog(&local_24c);
  }
  pcVar17 = *(char **)prefix;
  iVar5 = *(int *)(prefix + 0x20);
  bVar4 = IsTrue(true);
  if (!bVar4) {
    GTestLog::GTestLog(&local_24c,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/3rd_party/googletest/googletest/include/gtest/internal/gtest-internal.h"
                       ,0x226);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Condition !test_case_fp || !test_suite_fp failed. ",0x32);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,
               "Test can not provide both TearDownTestSuite and TearDownTestCase, please make sure there is only one present at"
               ,0x6f);
    if (pcVar17 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x232748);
    }
    else {
      sVar7 = strlen(pcVar17);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar17,sVar7);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,":",1);
    std::ostream::operator<<((ostream *)&std::cerr,iVar5);
    GTestLog::~GTestLog(&local_24c);
  }
  pTVar8 = (TestFactoryBase *)operator_new(8);
  pTVar8->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00225d08;
  type_names_00 =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)&TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_char,0u,2u>>>
           ::dummy_;
  code_location_00 = &local_228;
  pcVar18 = (char *)0x0;
  MakeAndRegisterTestInfo
            ((char *)local_1e0,paVar15->_M_local_buf,_Var1._M_p,(char *)0x0,code_location_00,
             &TypeIdHelper<(anonymous_namespace)::BitFieldAssignment<(anonymous_namespace)::param<unsigned_char,0u,2u>>>
              ::dummy_,(SetUpTestSuiteFunc)0x0,(TearDownTestSuiteFunc)0x0,pTVar8);
  iVar5 = (int)code_location_00;
  pcVar17 = extraout_RDX_10;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228.file._M_dataplus._M_p != &local_228.file.field_2) {
    operator_delete(local_228.file._M_dataplus._M_p,local_228.file.field_2._M_allocated_capacity + 1
                   );
    pcVar17 = extraout_RDX_11;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    pcVar17 = extraout_RDX_12;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != &local_160.field_2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    pcVar17 = extraout_RDX_13;
  }
  if (local_140 != &local_130) {
    operator_delete(local_140,local_130._M_allocated_capacity + 1);
    pcVar17 = extraout_RDX_14;
  }
  if (local_290 != &local_280) {
    operator_delete(local_290,local_280 + 1);
    pcVar17 = extraout_RDX_15;
  }
  if (local_270 != &local_260) {
    operator_delete(local_270,local_260 + 1);
    pcVar17 = extraout_RDX_16;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    pcVar17 = extraout_RDX_17;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    pcVar17 = extraout_RDX_18;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
    pcVar17 = extraout_RDX_19;
  }
  bVar4 = TypeParameterizedTest<(anonymous_namespace)::BitFieldAssignment,_testing::internal::TemplateSel<BitFieldAssignment_Assignment_Test>,_testing::internal::Types<(anonymous_namespace)::param<unsigned_char,_1U,_2U>,_(anonymous_namespace)::param<unsigned_char,_6U,_2U>,_(anonymous_namespace)::param<unsigned_short,_7U,_2U>,_(anonymous_namespace)::param<unsigned_short,_8U,_2U>,_(anonymous_namespace)::param<unsigned_short,_14U,_2U>,_(anonymous_namespace)::param<unsigned_int,_15U,_2U>,_(anonymous_namespace)::param<unsigned_int,_16U,_2U>,_(anonymous_namespace)::param<unsigned_long,_31U,_2U>,_(anonymous_namespace)::param<unsigned_long,_32U,_2U>,_(anonymous_namespace)::param<unsigned_long,_62U,_2U>,_(anonymous_namespace)::param<unsigned_char,_0U,_7U>,_(anonymous_namespace)::param<unsigned_char,_0U,_8U>,_(anonymous_namespace)::param<unsigned_short,_0U,_9U>,_(anonymous_namespace)::param<unsigned_short,_0U,_15U>,_(anonymous_namespace)::param<unsigned_short,_0U,_16U>,_(anonymous_namespace)::param<unsigned_int,_0U,_17U>,_(anonymous_namespace)::param<unsigned_int,_0U,_31U>,_(anonymous_namespace)::param<unsigned_int,_0U,_32U>,_(anonymous_namespace)::param<unsigned_long,_0U,_63U>,_(anonymous_namespace)::param<unsigned_long,_0U,_64U>_>_>
          ::Register(prefix,local_190,pcVar17,pcVar18,iVar5,type_names_00);
  return bVar4;
}

Assistant:

static bool Register(const char* prefix, const CodeLocation& code_location,
                       const char* case_name, const char* test_names, int index,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name +
         "/" + type_names[static_cast<size_t>(index)])
            .c_str(),
        StripTrailingSpaces(GetPrefixUntilComma(test_names)).c_str(),
        GetTypeName<Type>().c_str(),
        nullptr,  // No value parameter.
        code_location, GetTypeId<FixtureClass>(),
        SuiteApiResolver<TestClass>::GetSetUpCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        SuiteApiResolver<TestClass>::GetTearDownCaseOrSuite(
            code_location.file.c_str(), code_location.line),
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel,
                                 typename Types::Tail>::Register(prefix,
                                                                 code_location,
                                                                 case_name,
                                                                 test_names,
                                                                 index + 1,
                                                                 type_names);
  }